

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O2

void sysbvm_jit_patchTrampolineWithRealEntryPoint
               (sysbvm_bytecodeJit_t *jit,sysbvm_functionBytecode_t *bytecode)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  _Bool _Var4;
  void *executablePointer;
  void *writePointer;
  long lVar5;
  
  uVar1 = bytecode->jittedCodeTrampoline;
  if (((uVar1 == 0) || (uVar2 = bytecode->jittedCodeTrampolineWritePointer, uVar2 == 0)) ||
     (bytecode->jittedCodeTrampolineSessionToken != (jit->context->roots).sessionToken)) {
    return;
  }
  uVar3 = bytecode->jittedCode;
  if ((uVar3 & 0xf) == 0) {
    lVar5 = *(long *)(uVar3 + 0x10);
  }
  else {
    lVar5 = (long)uVar3 >> 4;
  }
  if ((uVar1 & 0xf) == 0) {
    executablePointer = *(void **)(uVar1 + 0x10);
  }
  else {
    executablePointer = (void *)((long)uVar1 >> 4);
  }
  if ((uVar2 & 0xf) == 0) {
    writePointer = *(void **)(uVar2 + 0x10);
  }
  else {
    writePointer = (void *)((long)uVar2 >> 4);
  }
  _Var4 = sysbvm_virtualMemory_lockCodePagesForWriting(writePointer,executablePointer,0x10);
  if (_Var4) {
    *(long *)((long)writePointer + 6) = lVar5;
    sysbvm_virtualMemory_unlockCodePagesForExecution(writePointer,executablePointer,0x10);
    return;
  }
  abort();
}

Assistant:

SYSBVM_API void sysbvm_jit_patchTrampolineWithRealEntryPoint(sysbvm_bytecodeJit_t *jit, sysbvm_functionBytecode_t *bytecode)
{
    if(bytecode->jittedCodeTrampoline && bytecode->jittedCodeTrampolineWritePointer && bytecode->jittedCodeTrampolineSessionToken == jit->context->roots.sessionToken)
    {
        uint8_t *realEntryPoint = (uint8_t*)sysbvm_tuple_systemHandle_decode(bytecode->jittedCode);
        uint8_t *trampolineEntryPointExecutePointer = (uint8_t*)sysbvm_tuple_systemHandle_decode(bytecode->jittedCodeTrampoline);
        uint8_t *trampolineEntryPointWritePointer = (uint8_t*)sysbvm_tuple_systemHandle_decode(bytecode->jittedCodeTrampolineWritePointer);

        size_t trampolineCodeSize = 16;
        if(!sysbvm_virtualMemory_lockCodePagesForWriting(trampolineEntryPointWritePointer, trampolineEntryPointExecutePointer, trampolineCodeSize))
            abort();

        size_t targetAddressOffset = trampolineCodeSize - 2 - sizeof(void*);
        uintptr_t *jumpAddressLocation = (uintptr_t*)(trampolineEntryPointWritePointer + targetAddressOffset);
        *jumpAddressLocation = (uintptr_t)realEntryPoint;

        sysbvm_virtualMemory_unlockCodePagesForExecution(trampolineEntryPointWritePointer, trampolineEntryPointExecutePointer, trampolineCodeSize);
    }
}